

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen.cpp
# Opt level: O2

Read<signed_char> __thiscall Omega_h::get_edge_codes(Omega_h *this,Mesh *mesh)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"collapse_code",&local_31);
  Mesh::get_array<signed_char>((Mesh *)this,(Int)mesh,(string *)0x1);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"collapse_code",&local_31);
  Mesh::remove_tag(mesh,1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

static Read<I8> get_edge_codes(Mesh* mesh) {
  auto edge_cand_codes = mesh->get_array<I8>(EDGE, "collapse_code");
  mesh->remove_tag(EDGE, "collapse_code");
  return edge_cand_codes;
}